

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_table_column_metadata
              (sqlite3 *db,char *zDbName,char *zTableName,char *zColumnName,char **pzDataType,
              char **pzCollSeq,int *pNotNull,int *pPrimaryKey,int *pAutoinc)

{
  char *pcVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  int err_code;
  int iVar5;
  uint uVar6;
  Table *pTVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  uint uVar11;
  ushort uVar12;
  long lVar13;
  Column *pCol;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  long in_FS_OFFSET;
  bool bVar17;
  char *zErrMsg;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = (char *)0x0;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  if (db->noSharedCache == '\0') {
    btreeEnterAll(db);
  }
  err_code = sqlite3Init(db,&local_40);
  if ((err_code != 0) || (pTVar7 = sqlite3FindTable(db,zTableName,zDbName), pTVar7 == (Table *)0x0))
  {
LAB_0012ef1d:
    bVar17 = false;
    pcVar8 = (char *)0x0;
    pcVar10 = (char *)0x0;
    uVar14 = 0;
    uVar6 = 0;
    uVar11 = 0;
    goto LAB_0012ef36;
  }
  if (pTVar7->eTabType == '\x02') goto LAB_0012f098;
  if (zColumnName != (char *)0x0) {
    uVar6 = (uint)pTVar7->nCol;
    if (0 < (int)uVar6) {
      uVar15 = 0;
LAB_0012f0d8:
      lVar13 = 0;
      do {
        bVar2 = pTVar7->aCol[uVar15].zCnName[lVar13];
        bVar3 = zColumnName[lVar13];
        if (bVar2 == bVar3) {
          if ((ulong)bVar2 == 0) goto LAB_0012f10f;
        }
        else if (""[bVar2] != ""[bVar3]) goto LAB_0012f10f;
        lVar13 = lVar13 + 1;
      } while( true );
    }
    uVar14 = 0;
    pCol = (Column *)0x0;
    goto LAB_0012f13e;
  }
  pCol = (Column *)0x0;
  uVar14 = 0;
LAB_0012f187:
  uVar11 = 0;
  if (pCol == (Column *)0x0) {
    uVar12 = 1;
    pcVar8 = "INTEGER";
    pcVar9 = (char *)0x0;
    bVar17 = false;
  }
  else {
    pcVar8 = sqlite3ColumnType(pCol,(char *)0x0);
    uVar12 = pCol->colFlags;
    pcVar9 = (char *)0x0;
    if ((uVar12 >> 9 & 1) != 0) {
      pcVar9 = pCol->zCnName + -1;
      do {
        pcVar10 = pcVar9 + 1;
        pcVar9 = pcVar9 + 1;
      } while (*pcVar10 != '\0');
      pcVar10 = pcVar9;
      if ((uVar12 & 4) != 0) {
        do {
          pcVar9 = pcVar10 + 1;
          pcVar1 = pcVar10 + 1;
          pcVar10 = pcVar9;
        } while (*pcVar1 != '\0');
      }
      pcVar9 = pcVar9 + 1;
    }
    bVar17 = (pCol->field_0x8 & 0xf) != 0;
    uVar12 = uVar12 & 1;
    if (uVar14 == (int)pTVar7->iPKey) {
      uVar11 = pTVar7->tabFlags >> 3 & 1;
    }
    else {
      uVar11 = 0;
    }
  }
  uVar6 = (uint)uVar12;
  uVar14 = (uint)bVar17;
  pcVar10 = "BINARY";
  if (pcVar9 != (char *)0x0) {
    pcVar10 = pcVar9;
  }
  bVar17 = true;
LAB_0012ef36:
  if (db->noSharedCache == '\0') {
    btreeLeaveAll(db);
  }
  if (pzDataType != (char **)0x0) {
    *pzDataType = pcVar8;
  }
  if (pzCollSeq != (char **)0x0) {
    *pzCollSeq = pcVar10;
  }
  if (pNotNull != (int *)0x0) {
    *pNotNull = uVar14;
  }
  if (pPrimaryKey != (int *)0x0) {
    *pPrimaryKey = uVar6;
  }
  if (pAutoinc != (int *)0x0) {
    *pAutoinc = uVar11;
  }
  if (err_code == 0 && !bVar17) {
    if (local_40 != (char *)0x0) {
      sqlite3DbFreeNN(db,local_40);
    }
    local_40 = sqlite3MPrintf(db,"no such table column: %s.%s",zTableName,zColumnName);
    err_code = 1;
  }
  pcVar10 = "%s";
  if (local_40 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  iVar5 = 0;
  sqlite3ErrorWithMsg(db,err_code,pcVar10);
  if (local_40 != (char *)0x0) {
    sqlite3DbFreeNN(db,local_40);
  }
  if ((err_code != 0) || (db->mallocFailed != '\0')) {
    iVar5 = apiHandleError(db,err_code);
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar5;
LAB_0012f10f:
  uVar16 = uVar15;
  uVar4 = uVar15;
  if ((bVar2 == bVar3) ||
     (uVar15 = uVar15 + 1, uVar16 = (ulong)uVar6, uVar4 = (ulong)(uVar6 - 1), uVar15 == uVar6))
  goto LAB_0012f122;
  goto LAB_0012f0d8;
LAB_0012f122:
  pCol = pTVar7->aCol + uVar4;
  uVar14 = (uint)uVar16;
LAB_0012f13e:
  if (uVar14 == uVar6) {
    if ((pTVar7->tabFlags & 0x80) != 0) {
LAB_0012f098:
      bVar17 = false;
      pcVar8 = (char *)0x0;
      pcVar10 = (char *)0x0;
      uVar14 = 0;
      uVar6 = 0;
      uVar11 = 0;
      goto LAB_0012ef36;
    }
    iVar5 = sqlite3IsRowid(zColumnName);
    if (iVar5 == 0) goto LAB_0012ef1d;
    uVar14 = (uint)pTVar7->iPKey;
    if ((int)uVar14 < 0) {
      pCol = (Column *)0x0;
    }
    else {
      pCol = pTVar7->aCol + uVar14;
    }
  }
  goto LAB_0012f187;
}

Assistant:

SQLITE_API int sqlite3_table_column_metadata(
  sqlite3 *db,                /* Connection handle */
  const char *zDbName,        /* Database name or NULL */
  const char *zTableName,     /* Table name */
  const char *zColumnName,    /* Column name */
  char const **pzDataType,    /* OUTPUT: Declared data type */
  char const **pzCollSeq,     /* OUTPUT: Collation sequence name */
  int *pNotNull,              /* OUTPUT: True if NOT NULL constraint exists */
  int *pPrimaryKey,           /* OUTPUT: True if column part of PK */
  int *pAutoinc               /* OUTPUT: True if column is auto-increment */
){
  int rc;
  char *zErrMsg = 0;
  Table *pTab = 0;
  Column *pCol = 0;
  int iCol = 0;
  char const *zDataType = 0;
  char const *zCollSeq = 0;
  int notnull = 0;
  int primarykey = 0;
  int autoinc = 0;


#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTableName==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif

  /* Ensure the database schema has been loaded */
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  rc = sqlite3Init(db, &zErrMsg);
  if( SQLITE_OK!=rc ){
    goto error_out;
  }

  /* Locate the table in question */
  pTab = sqlite3FindTable(db, zTableName, zDbName);
  if( !pTab || IsView(pTab) ){
    pTab = 0;
    goto error_out;
  }

  /* Find the column for which info is requested */
  if( zColumnName==0 ){
    /* Query for existence of table only */
  }else{
    for(iCol=0; iCol<pTab->nCol; iCol++){
      pCol = &pTab->aCol[iCol];
      if( 0==sqlite3StrICmp(pCol->zCnName, zColumnName) ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      if( HasRowid(pTab) && sqlite3IsRowid(zColumnName) ){
        iCol = pTab->iPKey;
        pCol = iCol>=0 ? &pTab->aCol[iCol] : 0;
      }else{
        pTab = 0;
        goto error_out;
      }
    }
  }

  /* The following block stores the meta information that will be returned
  ** to the caller in local variables zDataType, zCollSeq, notnull, primarykey
  ** and autoinc. At this point there are two possibilities:
  **
  **     1. The specified column name was rowid", "oid" or "_rowid_"
  **        and there is no explicitly declared IPK column.
  **
  **     2. The table is not a view and the column name identified an
  **        explicitly declared column. Copy meta information from *pCol.
  */
  if( pCol ){
    zDataType = sqlite3ColumnType(pCol,0);
    zCollSeq = sqlite3ColumnColl(pCol);
    notnull = pCol->notNull!=0;
    primarykey  = (pCol->colFlags & COLFLAG_PRIMKEY)!=0;
    autoinc = pTab->iPKey==iCol && (pTab->tabFlags & TF_Autoincrement)!=0;
  }else{
    zDataType = "INTEGER";
    primarykey = 1;
  }
  if( !zCollSeq ){
    zCollSeq = sqlite3StrBINARY;
  }

error_out:
  sqlite3BtreeLeaveAll(db);

  /* Whether the function call succeeded or failed, set the output parameters
  ** to whatever their local counterparts contain. If an error did occur,
  ** this has the effect of zeroing all output parameters.
  */
  if( pzDataType ) *pzDataType = zDataType;
  if( pzCollSeq ) *pzCollSeq = zCollSeq;
  if( pNotNull ) *pNotNull = notnull;
  if( pPrimaryKey ) *pPrimaryKey = primarykey;
  if( pAutoinc ) *pAutoinc = autoinc;

  if( SQLITE_OK==rc && !pTab ){
    sqlite3DbFree(db, zErrMsg);
    zErrMsg = sqlite3MPrintf(db, "no such table column: %s.%s", zTableName,
        zColumnName);
    rc = SQLITE_ERROR;
  }
  sqlite3ErrorWithMsg(db, rc, (zErrMsg?"%s":0), zErrMsg);
  sqlite3DbFree(db, zErrMsg);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}